

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddgraph.hxx
# Opt level: O2

void __thiscall
lddgraph::ldd(lddgraph *this,string *file,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *libraries)

{
  bool bVar1;
  istream *piVar2;
  long lVar3;
  string lddline;
  string cmdresult;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  istringstream cmdstream;
  
  cmdresult._M_dataplus._M_p = (pointer)&cmdresult.field_2;
  cmdresult._M_string_length = 0;
  cmdresult.field_2._M_local_buf[0] = '\0';
  if (this->_useldd == true) {
    std::operator+(&lddline,"ldd ",file);
    system((char *)&cmdstream);
    std::__cxx11::string::operator=((string *)&cmdresult,(string *)&cmdstream);
    std::__cxx11::string::~string((string *)&cmdstream);
    std::__cxx11::string::~string((string *)&lddline);
  }
  else {
    setenv("LD_TRACE_LOADED_OBJECTS","1",1);
    system((char *)&cmdstream);
    std::__cxx11::string::operator=((string *)&cmdresult,(string *)&cmdstream);
    std::__cxx11::string::~string((string *)&cmdstream);
    unsetenv("LD_TRACE_LOADED_OBJECTS");
  }
  if (this->_verbose == true) {
    std::operator<<((ostream *)&std::cout,(string *)&cmdresult);
  }
  std::__cxx11::istringstream::istringstream((istringstream *)&cmdstream,(string *)&cmdresult,_S_in)
  ;
  lddline._M_dataplus._M_p = (pointer)&lddline.field_2;
  lddline._M_string_length = 0;
  lddline.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&cmdstream,(string *)&lddline,'\n');
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::string(local_210,(string *)&lddline);
    std::__cxx11::string::string<std::allocator<char>>(local_1d0,"=>",(allocator<char> *)local_1f0);
    lVar3 = std::__cxx11::string::find(local_210,(ulong)local_1d0);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_210);
    if (lVar3 != -1) {
      std::__cxx11::string::find((char)&lddline,0x3e);
      std::__cxx11::string::substr((ulong)local_1f0,(ulong)&lddline);
      std::__cxx11::string::operator=((string *)&lddline,local_1f0);
      std::__cxx11::string::~string(local_1f0);
    }
    std::__cxx11::string::find((char)&lddline,0x28);
    std::__cxx11::string::substr((ulong)local_1f0,(ulong)&lddline);
    std::__cxx11::string::operator=((string *)&lddline,local_1f0);
    std::__cxx11::string::~string(local_1f0);
    trim(&lddline);
    if (lddline._M_string_length != 0) {
      bVar1 = std::operator!=(file,&lddline);
      if (bVar1) {
        trim(&lddline);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(libraries,&lddline);
      }
    }
  }
  std::__cxx11::string::~string((string *)&lddline);
  std::__cxx11::istringstream::~istringstream((istringstream *)&cmdstream);
  std::__cxx11::string::~string((string *)&cmdresult);
  return;
}

Assistant:

void ldd(const string & file, vector<string> & libraries)
    {
      string cmdresult;
      if (_useldd)
      {
        cmdresult = system("ldd " + file);
      }
      else
      {
        setenv("LD_TRACE_LOADED_OBJECTS", "1", 1);
        cmdresult = system(file);
        unsetenv("LD_TRACE_LOADED_OBJECTS");
      }
      if (_verbose)
        cout << cmdresult;
      istringstream cmdstream(cmdresult);
      string lddline;
      while (std::getline(cmdstream, lddline, '\n'))
      {
        if (contains(lddline, "=>"))
          lddline = lddline.substr(lddline.find_first_of('>') + 1);
        lddline = lddline.substr(0, lddline.find_first_of('('));
        trim(lddline);
        if (lddline.size() > 0 && file != lddline)
          libraries.push_back(trim(lddline));
      }
    }